

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_send_ws_header(mg_connection *nc,int op,size_t len,ws_mask_ctx *ctx)

{
  uint uVar1;
  int len_00;
  size_t sVar2;
  long lVar3;
  byte bVar4;
  ushort uVar5;
  uchar header [10];
  
  header[0] = ((byte)op & 0xf | (byte)((uint)op >> 1) & 0x80) + 0x80;
  if (len < 0x7e) {
    header[1] = (uchar)len;
    bVar4 = header[1] | 0x80;
    len_00 = 2;
  }
  else if (len < 0xffff) {
    uVar5 = (ushort)len << 8 | (ushort)len >> 8;
    header[1] = '~';
    header[2] = (char)uVar5;
    header[3] = (char)(uVar5 >> 8);
    len_00 = 4;
    bVar4 = 0xfe;
  }
  else {
    header[1] = '\x7f';
    uVar1 = (uint)(len >> 0x20);
    header._2_4_ = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = (uint)len;
    header._6_4_ = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    len_00 = 10;
    bVar4 = 0xff;
  }
  if (nc->listener == (mg_connection *)0x0) {
    header[1] = bVar4;
    mg_send(nc,header,len_00);
    lVar3 = random();
    ctx->mask = (uint32_t)lVar3;
    mg_send(nc,&ctx->mask,4);
    sVar2 = (nc->send_mbuf).len;
  }
  else {
    mg_send(nc,header,len_00);
    sVar2 = 0;
  }
  ctx->pos = sVar2;
  return;
}

Assistant:

static void mg_send_ws_header(struct mg_connection *nc, int op, size_t len,
                              struct ws_mask_ctx *ctx) {
    int header_len;
    unsigned char header[10];

    header[0] = (op & WEBSOCKET_DONT_FIN ? 0x0 : 0x80) + (op & 0x0f);
    if (len < 126) {
        header[1] = len;
        header_len = 2;
    } else if (len < 65535) {
        uint16_t tmp = htons((uint16_t) len);
        header[1] = 126;
        memcpy(&header[2], &tmp, sizeof(tmp));
        header_len = 4;
    } else {
        uint32_t tmp;
        header[1] = 127;
        tmp = htonl((uint32_t) ((uint64_t) len >> 32));
        memcpy(&header[2], &tmp, sizeof(tmp));
        tmp = htonl((uint32_t) (len & 0xffffffff));
        memcpy(&header[6], &tmp, sizeof(tmp));
        header_len = 10;
    }

    /* client connections enable masking */
    if (nc->listener == NULL) {
        header[1] |= 1 << 7; /* set masking flag */
        mg_send(nc, header, header_len);
        ctx->mask = ws_random_mask();
        mg_send(nc, &ctx->mask, sizeof(ctx->mask));
        ctx->pos = nc->send_mbuf.len;
    } else {
        mg_send(nc, header, header_len);
        ctx->pos = 0;
    }
}